

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecontainer.cpp
# Opt level: O0

void __thiscall stackjit::ImageContainer::loadClassBody(ImageContainer *this,string *className)

{
  AssemblyImage *this_00;
  size_type sVar1;
  mapped_type *ppAVar2;
  string local_38 [32];
  key_type *local_18;
  string *className_local;
  ImageContainer *this_local;
  
  local_18 = className;
  className_local = (string *)this;
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::AssemblyImage_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::AssemblyImage_*>_>_>
          ::count(&this->mClassToImage,className);
  if (sVar1 != 0) {
    ppAVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::AssemblyImage_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::AssemblyImage_*>_>_>
              ::operator[](&this->mClassToImage,local_18);
    this_00 = *ppAVar2;
    std::__cxx11::string::string(local_38,(string *)local_18);
    AssemblyImage::loadClassBody(this_00,(string *)local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void ImageContainer::loadClassBody(const std::string& className) {
		if (mClassToImage.count(className) > 0) {
			mClassToImage[className]->loadClassBody(className);
		}
	}